

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::samplers::Sampler_testProbabilisticSamplerErrors_Test::TestBody
          (Sampler_testProbabilisticSamplerErrors_Test *this)

{
  char *pcVar1;
  int local_80 [2];
  double local_78;
  AssertionResult gtest_ar;
  ProbabilisticSampler sampler;
  
  ProbabilisticSampler::ProbabilisticSampler(&sampler,-0.1);
  local_80[0] = 0;
  local_78 = sampler._samplingRate;
  testing::internal::CmpHelperLE<int,double>
            ((internal *)&gtest_ar,"0","sampler.samplingRate()",local_80,&local_78);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
               ,0x69,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)&local_78);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_80[0] = 1;
    local_78 = sampler._samplingRate;
    testing::internal::CmpHelperGE<int,double>
              ((internal *)&gtest_ar,"1","sampler.samplingRate()",local_80,&local_78);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_78);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                 ,0x6a,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)&local_78);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      ProbabilisticSampler::ProbabilisticSampler((ProbabilisticSampler *)&gtest_ar,1.1);
      ProbabilisticSampler::operator=(&sampler,(ProbabilisticSampler *)&gtest_ar);
      ProbabilisticSampler::~ProbabilisticSampler((ProbabilisticSampler *)&gtest_ar);
      local_80[0] = 0;
      local_78 = sampler._samplingRate;
      testing::internal::CmpHelperLE<int,double>
                ((internal *)&gtest_ar,"0","sampler.samplingRate()",local_80,&local_78);
      if (gtest_ar.success_ != false) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        local_80[0] = 1;
        local_78 = sampler._samplingRate;
        testing::internal::CmpHelperGE<int,double>
                  ((internal *)&gtest_ar,"1","sampler.samplingRate()",local_80,&local_78);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_78);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_80,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                     ,0x6d,pcVar1);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)&local_78);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_78);
        }
        goto LAB_001cd651;
      }
      testing::Message::Message((Message *)&local_78);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                 ,0x6c,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)&local_78);
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_78);
LAB_001cd651:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  ProbabilisticSampler::~ProbabilisticSampler(&sampler);
  return;
}

Assistant:

TEST(Sampler, testProbabilisticSamplerErrors)
{
    ProbabilisticSampler sampler(-0.1);
    ASSERT_LE(0, sampler.samplingRate());
    ASSERT_GE(1, sampler.samplingRate());
    sampler = ProbabilisticSampler(1.1);
    ASSERT_LE(0, sampler.samplingRate());
    ASSERT_GE(1, sampler.samplingRate());
}